

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O3

uint32_t mpack_node_u32(mpack_node_t node)

{
  mpack_type_t mVar1;
  anon_union_8_7_c87e5bf0_for_value aVar2;
  float fVar3;
  mpack_tree_t *pmVar4;
  
  pmVar4 = node.tree;
  fVar3 = 0.0;
  if (pmVar4->error == mpack_ok) {
    mVar1 = (node.data)->type;
    if (((mVar1 == mpack_type_int) || (mVar1 == mpack_type_uint)) &&
       (aVar2 = (node.data)->value, aVar2.u >> 0x20 == 0)) {
      fVar3 = aVar2.f;
    }
    else {
      pmVar4->error = mpack_error_type;
      fVar3 = 0.0;
      if (pmVar4->error_fn != (mpack_tree_error_t)0x0) {
        (*pmVar4->error_fn)(pmVar4,mpack_error_type);
      }
    }
  }
  return (uint32_t)fVar3;
}

Assistant:

MPACK_INLINE uint32_t mpack_node_u32(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= UINT32_MAX)
            return (uint32_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0 && node.data->value.i <= UINT32_MAX)
            return (uint32_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}